

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall
SQCompilation::CodegenVisitor::visitIfStatement(CodegenVisitor *this,IfStatement *ifStmt)

{
  SQUnsignedInteger *pSVar1;
  SQInstruction *pSVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  SQFuncState *pSVar6;
  Node *this_00;
  long n;
  SQInteger SVar7;
  SQObjectPtr *pSVar8;
  long lVar9;
  uint uVar10;
  ulong pos;
  ulong uVar11;
  SQScope __oldscope__;
  SQObjectPtr local_58;
  SQInteger local_48;
  SQInteger SStack_40;
  
  lVar9 = (long)(ifStmt->super_Statement).super_Node._coordinates.lineStart;
  if (lVar9 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar9,this->_lineinfo,false);
  }
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar6 = this->_fs;
  (this->_scope).outers = pSVar6->_outers;
  SVar7 = SQFuncState::GetStackSize(pSVar6);
  (this->_scope).stacksize = SVar7;
  local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_58.super_SQObject._type = OT_NULL;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._5_1_ = '\0';
  local_58.super_SQObject._6_1_ = '\0';
  local_58.super_SQObject._7_1_ = '\0';
  uVar10 = (this->_scopedconsts)._size;
  uVar4 = (this->_scopedconsts)._allocated;
  if (uVar4 <= uVar10) {
    uVar10 = uVar10 * 2;
    uVar11 = 4;
    if (uVar10 != 0) {
      uVar11 = (ulong)uVar10;
    }
    pSVar8 = (SQObjectPtr *)
             sq_vm_realloc((this->_scopedconsts)._alloc_ctx,(this->_scopedconsts)._vals,
                           (ulong)uVar4 << 4,uVar11 << 4);
    (this->_scopedconsts)._vals = pSVar8;
    (this->_scopedconsts)._allocated = (size_type)uVar11;
  }
  pSVar8 = (this->_scopedconsts)._vals;
  uVar10 = (this->_scopedconsts)._size;
  (this->_scopedconsts)._size = uVar10 + 1;
  pSVar2 = (SQInstruction *)(pSVar8 + uVar10);
  pSVar2->field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)local_58.super_SQObject._type;
  pSVar2->op = local_58.super_SQObject._flags;
  pSVar2->_arg0 = local_58.super_SQObject._5_1_;
  pSVar2->_arg2 = local_58.super_SQObject._6_1_;
  pSVar2->_arg3 = local_58.super_SQObject._7_1_;
  ((SQObjectValue *)(pSVar2 + 1))->pTable = (SQTable *)local_58.super_SQObject._unVal;
  if ((pSVar8[uVar10].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar8[uVar10].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
              .super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_58);
  this_00 = &ifStmt->_cond->super_Node;
  bVar3 = this->_donot_get;
  this->_donot_get = false;
  Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
  this->_donot_get = bVar3;
  pSVar6 = this->_fs;
  SVar7 = SQFuncState::PopTarget(pSVar6);
  local_58.super_SQObject._5_1_ = (char)SVar7;
  local_58.super_SQObject._0_5_ = 0x2700000000;
  local_58.super_SQObject._0_8_ = (ulong)local_58.super_SQObject._4_2_ << 0x20;
  SQFuncState::AddInstruction(pSVar6,(SQInstruction *)&local_58);
  uVar11 = (ulong)((this->_fs->_instructions)._size - 1);
  Node::visit<SQCompilation::CodegenVisitor>(&ifStmt->_thenB->super_Node,this);
  sVar5 = (this->_fs->_instructions)._size;
  if (ifStmt->_elseB != (Statement *)0x0) {
    local_58.super_SQObject._type = 0;
    local_58.super_SQObject._flags = '\"';
    local_58.super_SQObject._5_1_ = '\0';
    local_58.super_SQObject._6_1_ = '\0';
    local_58.super_SQObject._7_1_ = '\0';
    SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_58);
    pos = (ulong)((this->_fs->_instructions)._size - 1);
    Node::visit<SQCompilation::CodegenVisitor>(&ifStmt->_elseB->super_Node,this);
    SQFuncState::SetInstructionParam(this->_fs,pos,1,((this->_fs->_instructions)._size - 1) - pos);
  }
  SQFuncState::SetInstructionParam
            (this->_fs,uVar11,1,
             (((sVar5 - 1) - uVar11) + 1) - (ulong)(ifStmt->_elseB == (Statement *)0x0));
  lVar9 = this->_fs->_outers;
  SVar7 = SQFuncState::GetStackSize(this->_fs);
  n = (this->_scope).stacksize;
  if (SVar7 != n) {
    SQFuncState::SetStackSize(this->_fs,n);
    if (lVar9 != this->_fs->_outers) {
      local_58.super_SQObject._4_4_ = 0x47;
      local_58.super_SQObject._type =
           *(anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_58);
    }
  }
  (this->_scope).outers = local_48;
  (this->_scope).stacksize = SStack_40;
  uVar10 = (this->_scopedconsts)._size - 1;
  (this->_scopedconsts)._size = uVar10;
  SQObjectPtr::~SQObjectPtr((this->_scopedconsts)._vals + uVar10);
  return;
}

Assistant:

void CodegenVisitor::visitIfStatement(IfStatement *ifStmt) {
    addLineNumber(ifStmt);
    BEGIN_SCOPE();

    visitForceGet(ifStmt->condition());

    _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
    SQInteger jnepos = _fs->GetCurrentPos();

    ifStmt->thenBranch()->visit(this);

    SQInteger endifblock = _fs->GetCurrentPos();

    if (ifStmt->elseBranch()) {
        _fs->AddInstruction(_OP_JMP);
        SQInteger jmppos = _fs->GetCurrentPos();
        ifStmt->elseBranch()->visit(this);
        _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
    }

    _fs->SetInstructionParam(jnepos, 1, endifblock - jnepos + (ifStmt->elseBranch() ? 1 : 0));
    END_SCOPE();
}